

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

void add_opvars(sp_lev *sp,char *fmt,...)

{
  char cVar1;
  char in_AL;
  undefined1 *dat;
  opvar *ov;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 in_RDX;
  int opc;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  int local_e8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  argp[0].overflow_arg_area = &stack0x00000008;
  uVar6 = 0x10;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    cVar1 = *fmt;
    opc = 0x28;
    switch(cVar1) {
    case 'i':
      dat = (undefined1 *)calloc(1,0x10);
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        puVar3 = (undefined8 *)((long)local_e8 + uVar4);
      }
      else {
        puVar3 = (undefined8 *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      uVar5 = *puVar3;
      *dat = 1;
      break;
    case 'j':
    case 'k':
    case 'l':
    case 'n':
    case 'p':
    case 'q':
    case 't':
    case 'u':
switchD_0010c88b_caseD_6a:
      fprintf(_stderr,"add_opvars: illegal format character \'%c\'.\n",(ulong)(uint)(int)cVar1);
      goto LAB_0010cb34;
    case 'm':
      dat = (undefined1 *)calloc(1,0x10);
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        puVar3 = (undefined8 *)((long)local_e8 + uVar4);
      }
      else {
        puVar3 = (undefined8 *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      uVar5 = *puVar3;
      *dat = 6;
      break;
    case 'o':
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        piVar2 = (int *)((long)local_e8 + uVar4);
      }
      else {
        piVar2 = (int *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      opc = *piVar2;
      if (0x4b < (ulong)(long)opc) {
        fprintf(_stderr,"add_opvars: unknown opcode \'%li\'.\n",(long)opc);
      }
      ov = (opvar *)0x0;
      goto LAB_0010cad8;
    case 'r':
      dat = (undefined1 *)calloc(1,0x10);
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        puVar3 = (undefined8 *)((long)local_e8 + uVar4);
      }
      else {
        puVar3 = (undefined8 *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      uVar5 = *puVar3;
      *dat = 5;
      break;
    case 's':
      ov = (opvar *)calloc(1,0x10);
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        puVar3 = (undefined8 *)((long)local_e8 + uVar4);
      }
      else {
        puVar3 = (undefined8 *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      set_opvar_str(ov,(char *)*puVar3);
      goto LAB_0010cad8;
    case 'v':
      ov = (opvar *)calloc(1,0x10);
      uVar4 = (ulong)uVar6;
      if (uVar4 < 0x29) {
        uVar6 = uVar6 + 8;
        puVar3 = (undefined8 *)((long)local_e8 + uVar4);
      }
      else {
        puVar3 = (undefined8 *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      }
      set_opvar_var(ov,(char *)*puVar3);
LAB_0010cad8:
      add_opcode(sp,opc,ov);
      goto LAB_0010cb34;
    default:
      if (cVar1 != ' ') {
        if (cVar1 == 'M') {
          dat = (undefined1 *)calloc(1,0x10);
          uVar4 = (ulong)uVar6;
          if (uVar4 < 0x29) {
            uVar6 = uVar6 + 8;
            puVar3 = (undefined8 *)((long)local_e8 + uVar4);
          }
          else {
            puVar3 = (undefined8 *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          uVar5 = *puVar3;
          *dat = 7;
        }
        else if (cVar1 == 'O') {
          dat = (undefined1 *)calloc(1,0x10);
          uVar4 = (ulong)uVar6;
          if (uVar4 < 0x29) {
            uVar6 = uVar6 + 8;
            puVar3 = (undefined8 *)((long)local_e8 + uVar4);
          }
          else {
            puVar3 = (undefined8 *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          uVar5 = *puVar3;
          *dat = 8;
        }
        else {
          if (cVar1 != 'c') {
            if (cVar1 == '\0') {
              return;
            }
            goto switchD_0010c88b_caseD_6a;
          }
          dat = (undefined1 *)calloc(1,0x10);
          uVar4 = (ulong)uVar6;
          if (uVar4 < 0x29) {
            uVar6 = uVar6 + 8;
            puVar3 = (undefined8 *)((long)local_e8 + uVar4);
          }
          else {
            puVar3 = (undefined8 *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          uVar5 = *puVar3;
          *dat = 4;
        }
        break;
      }
      goto LAB_0010cb34;
    }
    *(undefined8 *)(dat + 8) = uVar5;
    add_opcode(sp,0x28,dat);
LAB_0010cb34:
    fmt = fmt + 1;
  } while( true );
}

Assistant:

void add_opvars(sp_lev *sp, const char *fmt, ...)
{
	const char *p;
	va_list argp;

	va_start(argp, fmt);

	for (p = fmt; *p != '\0'; p++) {
	    switch(*p) {
	    case ' ': break;
	    case 'i':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_int(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'c':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_coord(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'r':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_region(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'm':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_mapchar(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'M':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_monst(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'O':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_obj(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 's':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_str(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'v':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_var(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'o':
		{
		    long i = va_arg(argp, int);
		    if (i < 0 || i >= MAX_SP_OPCODES)
			fprintf(stderr, "add_opvars: unknown opcode '%li'.\n", i);
		    add_opcode(sp, i, NULL);
		    break;
		}
	    default:
		fprintf(stderr, "add_opvars: illegal format character '%c'.\n", *p);
		break;
	    }
	}

	va_end(argp);
}